

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

bool __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)1>
::insert_media(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)1>
               *this,Media *media)

{
  bool bVar1;
  const_reference pvVar2;
  shared_ptr<Storage::Tape::Tape> local_30;
  byte local_19;
  Media *pMStack_18;
  bool inserted;
  Media *media_local;
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)1,_(CPU::MOS6502Esque::Type)1>
  *this_local;
  
  local_19 = 0;
  pMStack_18 = media;
  media_local = (Media *)this;
  bVar1 = std::
          vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ::empty(&media->tapes);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ::front(&pMStack_18->tapes);
    std::shared_ptr<Storage::Tape::Tape>::shared_ptr(&local_30,pvVar2);
    Storage::Tape::TapePlayer::set_tape((TapePlayer *)&this->tape_player_,&local_30);
    std::shared_ptr<Storage::Tape::Tape>::~shared_ptr(&local_30);
    local_19 = 1;
  }
  bVar1 = std::
          vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
          ::empty(&pMStack_18->disks);
  if (!bVar1) {
    bVar1 = insert_disks<Oric::Microdisc>(this,pMStack_18,&this->microdisc_,4);
    local_19 = (local_19 & 1) != 0 || bVar1;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			bool inserted = false;

			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
				inserted = true;
			}

			if(!media.disks.empty()) {
				switch(disk_interface) {
					case DiskInterface::BD500:		inserted |= insert_disks(media, bd500_, 4);		break;
					case DiskInterface::Jasmin:		inserted |= insert_disks(media, jasmin_, 4);	break;
					case DiskInterface::Microdisc:	inserted |= insert_disks(media, microdisc_, 4);	break;
					case DiskInterface::Pravetz:	inserted |= insert_disks(media, *diskii_.last_valid(), 2);	break;
					default: break;
				}
			}

			return inserted;
		}